

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O3

void __thiscall
InstructionSet::M50740::Parser<InstructionSet::M50740::Executor,_false>::parse
          (Parser<InstructionSet::M50740::Executor,_false> *this,Executor *target,uint8_t *storage,
          uint16_t start,uint16_t closing_bound)

{
  ulong uVar1;
  uint uVar2;
  pair<int,_InstructionSet::M50740::Instruction> pVar3;
  Decoder decoder;
  uint8_t local_59;
  Decoder local_58;
  
  uVar1 = (ulong)start;
  local_58.instr_.addressing_mode = Implied;
  local_58.instr_.opcode = '\0';
  local_58.phase_ = Instruction;
  local_58.operand_size_ = 0;
  local_58.operand_bytes_ = 0;
  local_58.consumed_ = 0;
  local_58.instr_.operation = Invalid;
  if (start <= closing_bound) {
    while( true ) {
      pVar3 = Decoder::decode(&local_58,storage + (uVar1 & 0xffff),
                              ((ulong)closing_bound + 1) - (uVar1 & 0xffff));
      if (pVar3.first < 1) break;
      local_59 = pVar3.second.opcode;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&(target->super_CachingExecutor).program_,&local_59);
      if ((pVar3.second.operation < CLC) && ((0x6e000000U >> (pVar3.second._0_4_ & 0x1f) & 1) != 0))
      {
        return;
      }
      uVar2 = (int)uVar1 + pVar3.first;
      uVar1 = (ulong)uVar2;
      if (closing_bound < (ushort)uVar2) {
        return;
      }
    }
  }
  return;
}

Assistant:

void parse(Target &target, const uint8_t *storage, uint16_t start, uint16_t closing_bound) {
		Decoder decoder;

		while(start <= closing_bound) {
			const auto next = decoder.decode(&storage[start], 1 + closing_bound - start);
			if(next.first <= 0) {
				// If there weren't enough bytes left before the closing bound to complete
				// an instruction, but implicitly there were some bytes left, announce overflow
				// and terminate.
				target.announce_overflow(start);
				return;
			} else {
				// Pass on the instruction.
				target.announce_instruction(start, next.second);

				if constexpr(!include_entries_and_accesses) {
					// Do a simplified test: is this a terminating operation?
					switch(next.second.operation) {
						case Operation::RTS: case Operation::RTI: case Operation::BRK:
						case Operation::JMP: case Operation::BRA:
						return;

						default: break;
					}
				} else {
					// Check for end of stream and potential new entry points.
					switch(next.second.operation) {
						// Terminating instructions.
						case Operation::RTS: case Operation::RTI: case Operation::BRK:
						return;

						// Terminating operations, possibly with implied additional entry point.
						case Operation::JMP:
							if(next.second.addressing_mode == AddressingMode::Absolute) {
								target.add_entry(uint16_t(storage[start + 1] | (storage[start + 2] << 8)));
							}
						return;
						case Operation::BRA:
							target.add_entry(uint16_t(start + 2 + int8_t(storage[start + 1])));
						return;

						// Instructions that suggest another entry point but don't terminate parsing.
						case Operation::BCC: case Operation::BCS:
						case Operation::BVC: case Operation::BVS:
						case Operation::BMI: case Operation::BPL:
						case Operation::BNE: case Operation::BEQ:
							target.add_entry(uint16_t(start + 2 + int8_t(storage[start + 1])));
						break;
						case Operation::JSR:
							switch(next.second.addressing_mode) {
								default: break;
								case AddressingMode::Absolute:
									target.add_entry(uint16_t(storage[start + 1] | (storage[start + 2] << 8)));
								break;
								case AddressingMode::SpecialPage:
									target.add_entry(uint16_t(storage[start + 1] | 0x1f00));
								break;
							}
						break;

						case Operation::BBS0:	case Operation::BBS1:	case Operation::BBS2:	case Operation::BBS3:
						case Operation::BBS4:	case Operation::BBS5:	case Operation::BBS6:	case Operation::BBS7:
						case Operation::BBC0:	case Operation::BBC1:	case Operation::BBC2:	case Operation::BBC3:
						case Operation::BBC4:	case Operation::BBC5:	case Operation::BBC6:	case Operation::BBC7:
							switch(next.second.addressing_mode) {
								default: break;
								case AddressingMode::AccumulatorRelative:
									target.add_entry(uint16_t(start + 2 + int8_t(storage[start + 1])));
								break;
								case AddressingMode::ZeroPageRelative:
									target.add_entry(uint16_t(start + 3 + int8_t(storage[start + 2])));
								break;
							}
						break;


						default: break;
					}

					// Provide any fixed address accesses.
					switch(next.second.addressing_mode) {
						case AddressingMode::Absolute:
							target.add_access(uint16_t(storage[start + 1] | (storage[start + 2] << 8)), access_type(next.second.operation));
						break;
						case AddressingMode::ZeroPage:	case AddressingMode::ZeroPageRelative:
							target.add_access(storage[start + 1], access_type(next.second.operation));
						break;
						case AddressingMode::ImmediateZeroPage:
							target.add_access(storage[start + 2], access_type(next.second.operation));
						break;

						default: break;
					}
				}

				// Advance.
				start += next.first;
			}
		}
	}